

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_do(connectdata *conn,_Bool *done)

{
  bool bVar1;
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  __off64_t _Var10;
  size_t sVar11;
  size_t len;
  size_t sVar12;
  undefined8 uVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  __off_t size;
  long lVar17;
  curl_off_t cVar18;
  size_t sVar19;
  bool bVar20;
  curltime cVar21;
  long local_170;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar15 = (data->state).buffer;
  *done = true;
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar2 = (undefined8 *)(data_00->req).protop;
  if (((data->set).field_0x913 & 0x20) == 0) {
    iVar8 = *(int *)(puVar2 + 2);
    iVar5 = fstat64(iVar8,(stat64 *)&statbuf);
    size = statbuf.st_size;
    if (iVar5 == -1) {
      size = 0;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var4 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,2,header,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_client_write(conn,2,"Accept-ranges: bytes\r\n",0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      iVar7 = 6;
      if (buffer.tm_wday != 0) {
        iVar7 = buffer.tm_wday + -1;
      }
      pcVar16 = "";
      if ((*(uint *)&(data->set).field_0x910 >> 0x1c & 1) == 0) {
        pcVar16 = "\r\n";
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
                     Curl_wkday[iVar7],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec,pcVar16);
      CVar6 = Curl_client_write(conn,2,header,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      Curl_pgrsSetDownloadSize(data,size);
      if ((*(uint *)&(data->set).field_0x910 >> 0x1c & 1) != 0) {
        return CURLE_OK;
      }
    }
    CVar6 = Curl_range(conn);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    cVar18 = (data->state).resume_from;
    if (cVar18 < 0) {
      if (iVar5 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      cVar18 = cVar18 + statbuf.st_size;
      (data->state).resume_from = cVar18;
    }
    if (size < cVar18) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    lVar17 = (data->req).maxdownload;
    local_170 = size - cVar18;
    if (0 < lVar17) {
      local_170 = lVar17;
    }
    bVar20 = local_170 != 0;
    if (iVar5 != -1) {
      Curl_pgrsSetDownloadSize(data,local_170);
      cVar18 = (data->state).resume_from;
    }
    if ((cVar18 != 0) && (_Var10 = lseek64(iVar8,cVar18,0), cVar18 != _Var10)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar1 = iVar5 != -1 && bVar20;
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar17 = 0;
    while( true ) {
      sVar11 = (data->set).buffer_size;
      if (iVar5 != -1 && bVar20) {
        if (local_170 < (long)sVar11) {
          sVar11 = curlx_sotouz(local_170);
        }
      }
      else {
        sVar11 = sVar11 - 1;
      }
      len = read(iVar8,pcVar15,sVar11);
      CVar6 = CURLE_OK;
      if (((long)len < 1) || (pcVar15[len] = '\0', CVar6 = CURLE_OK, bVar1 && local_170 == 0))
      goto LAB_0010ab45;
      sVar19 = 0;
      if (bVar1) {
        sVar19 = len;
      }
      CVar6 = Curl_client_write(conn,1,pcVar15,len);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      lVar17 = lVar17 + len;
      Curl_pgrsSetDownloadCounter(data,lVar17);
      iVar7 = Curl_pgrsUpdate(conn);
      if (iVar7 != 0) break;
      local_170 = local_170 - sVar19;
      cVar21 = Curl_now();
      CVar6 = Curl_speedcheck(data,cVar21);
      if (CVar6 != CURLE_OK) {
LAB_0010ab45:
        iVar8 = Curl_pgrsUpdate(conn);
        if (iVar8 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar6;
      }
    }
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    goto LAB_0010ab45;
  }
  pcVar15 = (char *)*puVar2;
  pcVar9 = strchr(pcVar15,0x2f);
  pcVar16 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar16;
  if (pcVar9 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar9[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar8 = open64(pcVar15,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar8 < 0) {
    uVar13 = *puVar2;
    pcVar15 = "Can\'t open %s for writing";
LAB_0010a945:
    Curl_failf(data_00,pcVar15,uVar13);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar17 = (data_00->state).infilesize;
    if (lVar17 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar17);
    }
    if ((data_00->state).resume_from < 0) {
      iVar5 = fstat64(iVar8,(stat64 *)&statbuf);
      if (iVar5 != 0) {
        close(iVar8);
        uVar13 = *puVar2;
        pcVar15 = "Can\'t get the size of %s";
        goto LAB_0010a945;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    lVar17 = 0;
    while (CVar6 = Curl_fillreadbuffer(conn,(data_00->set).buffer_size,(size_t *)header),
          CVar6 == CURLE_OK) {
      if (header._0_8_ == 0) {
        iVar5 = Curl_pgrsUpdate(conn);
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        if (iVar5 == 0) {
          CVar6 = CURLE_OK;
        }
        break;
      }
      lVar3 = (data_00->state).resume_from;
      sVar11 = header._0_8_;
      pcVar15 = pcVar16;
      if (lVar3 != 0) {
        sVar12 = header._0_8_ - lVar3;
        lVar14 = 0;
        if (sVar12 != 0 && lVar3 <= (long)header._0_8_) {
          lVar14 = lVar3;
        }
        sVar11 = 0;
        if (sVar12 != 0 && lVar3 <= (long)header._0_8_) {
          sVar11 = sVar12;
        }
        cVar18 = -sVar12;
        if (lVar3 < (long)header._0_8_) {
          cVar18 = 0;
        }
        (data_00->state).resume_from = cVar18;
        pcVar15 = pcVar16 + lVar14;
      }
      sVar12 = write(iVar8,pcVar15,sVar11);
      if (sVar12 != sVar11) {
        CVar6 = CURLE_SEND_ERROR;
        break;
      }
      lVar17 = lVar17 + sVar11;
      Curl_pgrsSetUploadCounter(data_00,lVar17);
      iVar5 = Curl_pgrsUpdate(conn);
      if (iVar5 != 0) {
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        break;
      }
      cVar21 = Curl_now();
      CVar6 = Curl_speedcheck(data_00,cVar21);
      if (CVar6 != CURLE_OK) break;
    }
    close(iVar8);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    msnprintf(header, sizeof(header),
              "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
              expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}